

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O0

void get_color_map_params
               (MACROBLOCK *x,int plane,BLOCK_SIZE bsize,TX_SIZE tx_size,COLOR_MAP_TYPE type,
               Av1ColorMapParam *params)

{
  char in_R8B;
  undefined8 *in_R9;
  BLOCK_SIZE in_stack_0000001b;
  int in_stack_0000001c;
  MACROBLOCK *in_stack_00000020;
  
  in_R9[4] = 0;
  in_R9[5] = 0;
  in_R9[2] = 0;
  in_R9[3] = 0;
  *in_R9 = 0;
  in_R9[1] = 0;
  if (in_R8B == '\0') {
    get_palette_params(in_stack_00000020,in_stack_0000001c,in_stack_0000001b,(Av1ColorMapParam *)x);
  }
  return;
}

Assistant:

static void get_color_map_params(const MACROBLOCK *const x, int plane,
                                 BLOCK_SIZE bsize, TX_SIZE tx_size,
                                 COLOR_MAP_TYPE type,
                                 Av1ColorMapParam *params) {
  (void)tx_size;
  memset(params, 0, sizeof(*params));
  switch (type) {
    case PALETTE_MAP: get_palette_params(x, plane, bsize, params); break;
    default: assert(0 && "Invalid color map type"); return;
  }
}